

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O0

int Gia_ManRexNumInputs(char *pStr,Vec_Int_t **pvAlphas,Vec_Int_t **pvStr2Sta)

{
  int iVar1;
  size_t sVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *vStr2Sta;
  Vec_Int_t *vAlphas;
  int local_28;
  int Length;
  int nStates;
  int i;
  Vec_Int_t **pvStr2Sta_local;
  Vec_Int_t **pvAlphas_local;
  char *pStr_local;
  
  local_28 = 0;
  sVar2 = strlen(pStr);
  p = Vec_IntAlloc(100);
  p_00 = Vec_IntStartFull((int)sVar2 + 1);
  for (Length = 0; Length < (int)sVar2; Length = Length + 1) {
    iVar1 = Gia_SymbSpecial(pStr[Length]);
    if (iVar1 == 0) {
      iVar1 = Vec_IntFind(p,(int)pStr[Length]);
      if (iVar1 == -1) {
        Vec_IntPush(p,(int)pStr[Length]);
      }
      Vec_IntWriteEntry(p_00,Length,local_28);
      local_28 = local_28 + 1;
    }
  }
  Vec_IntWriteEntry(p_00,Length,local_28);
  *pvAlphas = p;
  *pvStr2Sta = p_00;
  return local_28;
}

Assistant:

int Gia_ManRexNumInputs( char * pStr, Vec_Int_t ** pvAlphas, Vec_Int_t ** pvStr2Sta )
{
    int i, nStates = 0, Length = strlen(pStr);
    Vec_Int_t * vAlphas  = Vec_IntAlloc( 100 );            // alphabet
    Vec_Int_t * vStr2Sta = Vec_IntStartFull( Length + 1 ); // symbol to state
    for ( i = 0; i < Length; i++ )
    {
        if ( Gia_SymbSpecial(pStr[i]) )
            continue;
        if ( Vec_IntFind(vAlphas, pStr[i]) == -1 )
            Vec_IntPush( vAlphas, pStr[i] );
        Vec_IntWriteEntry( vStr2Sta, i, nStates++ );
    }
    Vec_IntWriteEntry( vStr2Sta, i, nStates );
    *pvAlphas  = vAlphas;
    *pvStr2Sta = vStr2Sta;
    return nStates;
}